

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

bool __thiscall
HighsHashTable<int,std::pair<double,int>>::insert<HighsHashTableEntry<int,std::pair<double,int>>>
          (HighsHashTable<int,std::pair<double,int>> *this,
          HighsHashTableEntry<int,_std::pair<double,_int>_> *args)

{
  undefined8 *puVar1;
  double dVar2;
  u8 uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  ulong uVar9;
  u8 meta;
  u64 pos;
  u64 maxPos;
  Entry entry;
  u64 startPos;
  u8 local_39;
  ulong local_38;
  ulong local_30;
  HighsHashTableEntry<int,_std::pair<double,_int>_> local_28;
  ulong local_10;
  
  local_28.value_.second = (args->value_).second;
  local_28.value_._12_4_ = *(undefined4 *)&(args->value_).field_0xc;
  local_28.key_ = args->key_;
  local_28._4_4_ = *(undefined4 *)&args->field_0x4;
  local_28.value_.first = (args->value_).first;
  bVar8 = HighsHashTable<int,_std::pair<double,_int>_>::findPosition
                    ((HighsHashTable<int,_std::pair<double,_int>_> *)this,&local_28.key_,&local_39,
                     &local_10,&local_30,&local_38);
  if (bVar8) {
    bVar8 = false;
  }
  else if ((*(ulong *)(this + 0x20) == *(long *)(this + 0x10) * 7 + 7U >> 3) ||
          (local_38 == local_30)) {
    HighsHashTable<int,_std::pair<double,_int>_>::growTable
              ((HighsHashTable<int,_std::pair<double,_int>_> *)this);
    bVar8 = insert<HighsHashTableEntry<int,std::pair<double,int>>>(this,&local_28);
  }
  else {
    lVar4 = *(long *)this;
    *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
    do {
      lVar5 = *(long *)(this + 8);
      if (-1 < (char)*(byte *)(lVar5 + local_38)) {
        *(u8 *)(lVar5 + local_38) = local_39;
        *(undefined8 *)(lVar4 + 0x10 + local_38 * 0x18) = local_28.value_._8_8_;
        puVar1 = (undefined8 *)(lVar4 + local_38 * 0x18);
        *puVar1 = local_28._0_8_;
        puVar1[1] = local_28.value_.first;
        goto LAB_002b4370;
      }
      uVar9 = (ulong)((int)local_38 - (uint)*(byte *)(lVar5 + local_38) & 0x7f);
      if (uVar9 < (local_38 - local_10 & *(ulong *)(this + 0x10))) {
        iVar6 = local_28.key_;
        iVar7 = local_28.value_.second;
        local_28.key_ = *(int *)(lVar4 + local_38 * 0x18);
        dVar2 = *(double *)(lVar4 + 8 + local_38 * 0x18);
        local_28.value_.second = *(int *)(lVar4 + 0x10 + local_38 * 0x18);
        *(int *)(lVar4 + local_38 * 0x18) = iVar6;
        *(double *)(lVar4 + 8 + local_38 * 0x18) = local_28.value_.first;
        *(int *)(lVar4 + 0x10 + local_38 * 0x18) = iVar7;
        uVar3 = *(u8 *)(lVar5 + local_38);
        *(u8 *)(lVar5 + local_38) = local_39;
        local_10 = local_38 - uVar9 & *(ulong *)(this + 0x10);
        local_30 = local_10 + 0x7f & *(ulong *)(this + 0x10);
        local_39 = uVar3;
        local_28.value_.first = dVar2;
      }
      local_38 = local_38 + 1 & *(ulong *)(this + 0x10);
    } while (local_38 != local_30);
    HighsHashTable<int,_std::pair<double,_int>_>::growTable
              ((HighsHashTable<int,_std::pair<double,_int>_> *)this);
    insert<HighsHashTableEntry<int,std::pair<double,int>>>(this,&local_28);
LAB_002b4370:
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }